

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_neon_pmull_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t result;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar2 = *(ulong *)((long)vn + (long)((int)desc >> 10) * 8);
  uVar7 = *(ulong *)((long)vm + (long)((int)desc >> 10) * 8);
  uVar1 = (uint)uVar2;
  uVar3 = (ulong)(uVar1 & 0xff000000) << 0x18 |
          (ulong)(uVar1 & 0xff0000) << 0x10 | (ulong)((uVar1 & 0xff00) << 8) | uVar2 & 0xff;
  uVar1 = (uint)uVar7;
  uVar5 = (ulong)(uVar1 & 0xff000000) << 0x18 |
          (ulong)(uVar1 & 0xff0000) << 0x10 | (ulong)((uVar1 & 0xff00) << 8) | uVar7 & 0xff;
  iVar6 = 8;
  uVar4 = 0;
  do {
    uVar4 = uVar4 ^ (uVar3 & 0x1000100010001) * 0xffff & uVar5;
    uVar3 = uVar3 >> 1;
    uVar5 = uVar5 * 2;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  *(ulong *)vd = uVar4;
  uVar7 = uVar7 >> 8 & 0xff000000000000 | uVar7 >> 0x10 & 0xff00000000 |
          uVar7 >> 0x18 & 0xff0000 | uVar7 >> 0x20 & 0xff;
  uVar5 = uVar2 >> 8 & 0xff000000000000 | uVar2 >> 0x10 & 0xff00000000 |
          uVar2 >> 0x18 & 0xff0000 | uVar2 >> 0x20 & 0xff;
  iVar6 = 8;
  uVar2 = 0;
  do {
    uVar2 = uVar2 ^ (uVar5 & 0x1000100010001) * 0xffff & uVar7;
    uVar5 = uVar5 >> 1;
    uVar7 = uVar7 * 2;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  *(ulong *)((long)vd + 8) = uVar2;
  uVar1 = desc >> 2 & 0xf8;
  if (8 < uVar1) {
    uVar2 = 0x10;
    if (0x10 < uVar1) {
      uVar2 = (ulong)uVar1;
    }
    memset((void *)((long)vd + 0x10),0,uVar2 - 8);
    return;
  }
  return;
}

Assistant:

void HELPER(neon_pmull_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    int hi = simd_data(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    uint64_t nn = n[hi], mm = m[hi];

    d[0] = pmull_h(expand_byte_to_half(nn), expand_byte_to_half(mm));
    nn >>= 32;
    mm >>= 32;
    d[1] = pmull_h(expand_byte_to_half(nn), expand_byte_to_half(mm));

    clear_tail(d, 16, simd_maxsz(desc));
}